

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhoc_agent_wrapper.cpp
# Opt level: O2

exception_reaction_t __thiscall
so_5::adhoc_agent_wrapper_t::so_exception_reaction(adhoc_agent_wrapper_t *this)

{
  exception_reaction_t eVar1;
  
  if (this->m_exception_reaction != inherit_exception_reaction) {
    return this->m_exception_reaction;
  }
  eVar1 = agent_t::so_exception_reaction(&this->super_agent_t);
  return eVar1;
}

Assistant:

exception_reaction_t
adhoc_agent_wrapper_t::so_exception_reaction() const
	{
		if( exception_reaction_t::inherit_exception_reaction !=
				m_exception_reaction )
			return m_exception_reaction;
		else
			// Let's basic implementation handle this case.
			return agent_t::so_exception_reaction();
	}